

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

string * __thiscall
minja::error_location_suffix(std::__cxx11::string_const&,unsigned_long)::$_0::operator()[abi_cxx11_
          (string *__return_storage_ptr__,void *this,size_t line)

{
  undefined8 in_RAX;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var1;
  size_t i;
  ulong uVar2;
  long lVar3;
  char *pcVar4;
  undefined8 uStack_38;
  
  pcVar4 = (char *)**this;
  uStack_38 = in_RAX;
  for (uVar2 = 1; lVar3 = **this + (*this)[1], uVar2 < line; uVar2 = uVar2 + 1) {
    uStack_38._0_7_ = CONCAT16(10,(undefined6)uStack_38);
    _Var1 = std::
            __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      (pcVar4,lVar3,(long)&uStack_38 + 6);
    pcVar4 = _Var1._M_current + 1;
  }
  uStack_38 = CONCAT17(10,(undefined7)uStack_38);
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                    (pcVar4,lVar3);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)__return_storage_ptr__,pcVar4,_Var1._M_current);
  return __return_storage_ptr__;
}

Assistant:

static std::string error_location_suffix(const std::string & source, size_t pos) {
  auto get_line = [&](size_t line) {
    auto start = source.begin();
    for (size_t i = 1; i < line; ++i) {
      start = std::find(start, source.end(), '\n') + 1;
    }
    auto end = std::find(start, source.end(), '\n');
    return std::string(start, end);
  };
  auto start = source.begin();
  auto end = source.end();
  auto it = start + pos;
  auto line = std::count(start, it, '\n') + 1;
  auto max_line = std::count(start, end, '\n') + 1;
  auto col = pos - std::string(start, it).rfind('\n');
  std::ostringstream out;
  out << " at row " << line << ", column " << col << ":\n";
  if (line > 1) out << get_line(line - 1) << "\n";
  out << get_line(line) << "\n";
  out << std::string(col - 1, ' ') << "^\n";
  if (line < max_line) out << get_line(line + 1) << "\n";

  return out.str();
}